

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O2

Vec_Vec_t * Gia_ManAssignCodes(int kHot,int nStates,int *pnBits)

{
  uint uVar1;
  Vec_Vec_t *p;
  int iVar2;
  char *__assertion;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (nStates < 1) {
    __assertion = "nStates > 0";
    uVar7 = 0x71;
LAB_00644eca:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,uVar7,"Vec_Vec_t *Gia_ManAssignCodes(int, int, int *)");
  }
  if (4 < kHot - 1U) {
    __assertion = "kHot >= 1 && kHot <= 5";
    uVar7 = 0x72;
    goto LAB_00644eca;
  }
  p = Vec_VecStart(nStates);
  *pnBits = -1;
  switch(kHot) {
  case 1:
    for (iVar2 = 0; nStates != iVar2; iVar2 = iVar2 + 1) {
      Vec_VecPushInt(p,iVar2,iVar2);
    }
    *pnBits = nStates;
    return p;
  case 2:
    for (; (kHot != 1000000000 && ((int)((kHot - 1U) * kHot) / 2 < nStates)); kHot = kHot + 1) {
    }
    *pnBits = kHot;
    iVar2 = 0;
    uVar7 = 0;
    while (uVar4 = uVar7, kHot != uVar4) {
      uVar6 = uVar4 + 1;
      while (uVar7 = uVar4 + 1, uVar6 < (uint)kHot) {
        Vec_VecPushInt(p,iVar2,uVar4);
        Vec_VecPushInt(p,iVar2,uVar6);
        iVar2 = iVar2 + 1;
        uVar6 = uVar6 + 1;
        if (nStates == iVar2) {
          return p;
        }
      }
    }
    goto LAB_00644ed0;
  case 3:
    for (uVar7 = kHot;
        (uVar7 != 1000000000 && ((int)((uVar7 - 2) * (uVar7 - 1) * uVar7) / 6 < nStates));
        uVar7 = uVar7 + 1) {
    }
    *pnBits = uVar7;
    iVar2 = 0;
    uVar4 = 0;
    while (uVar6 = uVar4, uVar7 != uVar6) {
      uVar4 = uVar6 + 1;
      while (uVar1 = uVar4, uVar4 = uVar6 + 1, uVar1 < uVar7) {
        uVar3 = uVar1 + 1;
        while (uVar4 = uVar1 + 1, uVar3 < uVar7) {
          Vec_VecPushInt(p,iVar2,uVar6);
          Vec_VecPushInt(p,iVar2,uVar1);
          Vec_VecPushInt(p,iVar2,uVar3);
          iVar2 = iVar2 + 1;
          uVar3 = uVar3 + 1;
          if (nStates == iVar2) {
            return p;
          }
        }
      }
    }
    if (kHot == 4) goto switchD_00644b4c_caseD_4;
    if (kHot != 5) goto LAB_00644ed0;
    break;
  case 4:
switchD_00644b4c_caseD_4:
    for (uVar7 = kHot;
        (uVar7 != 1000000000 &&
        ((int)((uVar7 - 3) * (uVar7 - 2) * (uVar7 - 1) * uVar7) / 0x18 < nStates));
        uVar7 = uVar7 + 1) {
    }
    *pnBits = uVar7;
    iVar2 = 0;
    uVar4 = 0;
    while (uVar6 = uVar4, uVar7 != uVar6) {
      uVar4 = uVar6 + 1;
      while (uVar1 = uVar4, uVar4 = uVar6 + 1, uVar1 < uVar7) {
        uVar4 = uVar1 + 1;
        while (uVar3 = uVar4, uVar4 = uVar1 + 1, uVar3 < uVar7) {
          uVar5 = uVar3 + 1;
          while (uVar4 = uVar3 + 1, (int)uVar5 < (int)uVar7) {
            Vec_VecPushInt(p,iVar2,uVar6);
            Vec_VecPushInt(p,iVar2,uVar1);
            Vec_VecPushInt(p,iVar2,uVar3);
            Vec_VecPushInt(p,iVar2,uVar5);
            iVar2 = iVar2 + 1;
            uVar5 = uVar5 + 1;
            if (nStates == iVar2) {
              return p;
            }
          }
        }
      }
    }
    if (kHot != 5) goto LAB_00644ed0;
    kHot = 5;
  }
  for (; (kHot != 1000000000 &&
         ((int)((kHot - 4U) * (kHot - 3U) * (kHot - 2U) * (kHot - 1U) * kHot) / 0x78 < nStates));
      kHot = kHot + 1) {
  }
  *pnBits = kHot;
  iVar2 = 0;
  uVar7 = 0;
  while (uVar4 = uVar7, kHot != uVar4) {
    uVar7 = uVar4 + 1;
    while (uVar6 = uVar7, uVar7 = uVar4 + 1, uVar6 < (uint)kHot) {
      uVar7 = uVar6 + 1;
      while (uVar1 = uVar7, uVar7 = uVar6 + 1, uVar1 < (uint)kHot) {
        uVar7 = uVar1 + 1;
        while (uVar3 = uVar7, uVar7 = uVar1 + 1, (int)uVar3 < kHot) {
          uVar5 = uVar3 + 1;
          while (uVar7 = uVar3 + 1, (int)uVar5 < kHot) {
            Vec_VecPushInt(p,iVar2,uVar4);
            Vec_VecPushInt(p,iVar2,uVar6);
            Vec_VecPushInt(p,iVar2,uVar1);
            Vec_VecPushInt(p,iVar2,uVar3);
            Vec_VecPushInt(p,iVar2,uVar5);
            iVar2 = iVar2 + 1;
            uVar5 = uVar5 + 1;
            if (nStates == iVar2) {
              return p;
            }
          }
        }
      }
    }
  }
LAB_00644ed0:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                ,200,"Vec_Vec_t *Gia_ManAssignCodes(int, int, int *)");
}

Assistant:

Vec_Vec_t * Gia_ManAssignCodes( int kHot, int nStates, int * pnBits )
{
    Vec_Vec_t * vCodes;
    int s, i1, i2, i3, i4, i5, nBits;
    assert( nStates > 0 );
    assert( kHot >= 1 && kHot <= 5 );
    vCodes = Vec_VecStart( nStates );
    *pnBits = -1;
    if ( kHot == 1 )
    {
        for ( i1 = 0; i1 < nStates; i1++ )
            Vec_VecPushInt( vCodes, i1, i1 );
        *pnBits = nStates;
        return vCodes;
    }
    if ( kHot == 2 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) / 2 >= nStates )
                break;
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 3 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) / 6 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 4 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) * (nBits-3) / 24 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        for ( i4 = i3 + 1; i4 < nBits; i4++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            Vec_VecPushInt( vCodes, s, i4 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 5 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) * (nBits-3) * (nBits-4) / 120 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        for ( i4 = i3 + 1; i4 < nBits; i4++ )
        for ( i5 = i4 + 1; i5 < nBits; i5++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            Vec_VecPushInt( vCodes, s, i4 );
            Vec_VecPushInt( vCodes, s, i5 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    assert( 0 );
    return NULL;
}